

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O1

Entry * cali::Entry::unpack(Entry *__return_storage_ptr__,CaliperMetadataAccessInterface *db,
                           uchar *buffer,size_t *inc)

{
  anon_union_8_7_33918203_for_value aVar1;
  int iVar2;
  undefined4 extraout_var;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  cali_variant_t cVar7;
  size_t p;
  size_t local_20;
  Node *pNVar3;
  
  bVar4 = 0;
  lVar5 = 0;
  uVar6 = 0;
  do {
    if (-1 < (char)buffer[lVar5]) goto LAB_00188f55;
    uVar6 = uVar6 | (ulong)(buffer[lVar5] & 0x7f) << (bVar4 & 0x3f);
    lVar5 = lVar5 + 1;
    bVar4 = bVar4 + 7;
  } while (lVar5 != 9);
  lVar5 = 9;
LAB_00188f55:
  local_20 = lVar5 + 1;
  iVar2 = (**db->_vptr_CaliperMetadataAccessInterface)
                    (db,(ulong)(buffer[lVar5] & 0x7f) << ((char)lVar5 * '\a' & 0x3fU) | uVar6);
  pNVar3 = (Node *)CONCAT44(extraout_var,iVar2);
  __return_storage_ptr__->m_node = pNVar3;
  aVar1 = (pNVar3->m_data).m_v.value;
  (__return_storage_ptr__->m_value).m_v.type_and_size = (pNVar3->m_data).m_v.type_and_size;
  (__return_storage_ptr__->m_value).m_v.value = aVar1;
  if (pNVar3->m_attribute == 8) {
    cVar7 = cali_variant_unpack(buffer + local_20,&local_20,(_Bool *)0x0);
    (__return_storage_ptr__->m_value).m_v = cVar7;
  }
  if (inc != (size_t *)0x0) {
    *inc = *inc + local_20;
  }
  return __return_storage_ptr__;
}

Assistant:

Entry Entry::unpack(const CaliperMetadataAccessInterface& db, const unsigned char* buffer, size_t* inc)
{
    size_t p = 0;
    Entry  ret { db.node(vldec_u64(buffer, &p)) };

    if (ret.m_node->attribute() == Attribute::NAME_ATTR_ID)
        ret.m_value = Variant::unpack(buffer + p, &p);

    if (inc)
        *inc += p;

    return ret;
}